

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall BuildWithLogTestRebuildAfterFailure::Run(BuildWithLogTestRebuildAfterFailure *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Builder *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  int *piVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  string err;
  string local_98;
  string local_78;
  string local_58;
  Plan *local_38;
  
  iVar4 = g_current_test->assertion_failures_;
  state = &(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule touch-fail-tick2\n  command = touch-fail-tick2\nbuild out1: touch-fail-tick2 in\n"
              ,(ManifestParserOptions)0x0);
  if (iVar4 == g_current_test->assertion_failures_) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"in","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    this_00 = &(this->super_BuildWithLogTest).super_BuildTest.fs_;
    VirtualFileSystem::Create(this_00,&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"out1","");
    this_01 = &(this->super_BuildWithLogTest).super_BuildTest.builder_;
    pNVar5 = Builder::AddTarget(this_01,&local_98,&local_58);
    testing::Test::Check
              (pTVar2,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x50e,"builder_.AddTarget(\"out1\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    bVar3 = Builder::Build(this_01,&local_58);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x50f,"builder_.Build(&err)");
    pTVar2 = g_current_test;
    iVar4 = std::__cxx11::string::compare((char *)&local_58);
    testing::Test::Check
              (pTVar2,iVar4 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x510,"\"\" == err");
    testing::Test::Check
              (g_current_test,
               (long)*(pointer *)
                      ((long)&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                              commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x511,"1u == command_runner_.commands_ran_.size()");
    this_02 = &(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(this_02,(this_02->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
    State::Reset(state);
    Builder::Cleanup(this_01);
    local_38 = &(this->super_BuildWithLogTest).super_BuildTest.builder_.plan_;
    Plan::Reset(local_38);
    piVar1 = &(this->super_BuildWithLogTest).super_BuildTest.fs_.now_;
    *piVar1 = *piVar1 + 1;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"in","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    VirtualFileSystem::Create(this_00,&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"out1","");
    pNVar5 = Builder::AddTarget(this_01,&local_98,&local_58);
    testing::Test::Check
              (pTVar2,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x51c,"builder_.AddTarget(\"out1\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    bVar3 = Builder::Build(this_01,&local_58);
    testing::Test::Check
              (pTVar2,!bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x51d,"builder_.Build(&err)");
    pTVar2 = g_current_test;
    iVar4 = std::__cxx11::string::compare((char *)&local_58);
    testing::Test::Check
              (pTVar2,iVar4 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x51e,"\"subcommand failed\" == err");
    testing::Test::Check
              (g_current_test,
               (long)*(pointer *)
                      ((long)&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                              commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x51f,"1u == command_runner_.commands_ran_.size()");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(this_02,(this_02->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
    State::Reset(state);
    Builder::Cleanup(this_01);
    Plan::Reset(local_38);
    piVar1 = &(this->super_BuildWithLogTest).super_BuildTest.fs_.now_;
    *piVar1 = *piVar1 + 1;
    pTVar2 = g_current_test;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"out1","");
    pNVar5 = Builder::AddTarget(this_01,&local_98,&local_58);
    testing::Test::Check
              (pTVar2,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x529,"builder_.AddTarget(\"out1\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    bVar3 = Builder::AlreadyUpToDate(this_01);
    testing::Test::Check
              (pTVar2,!bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x52a,"builder_.AlreadyUpToDate()");
    pTVar2 = g_current_test;
    bVar3 = Builder::Build(this_01,&local_58);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x52b,"builder_.Build(&err)");
    testing::Test::Check
              (g_current_test,
               (long)*(pointer *)
                      ((long)&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                              commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x52c,"1u == command_runner_.commands_ran_.size()");
    pTVar2 = g_current_test;
    iVar4 = std::__cxx11::string::compare((char *)&local_58);
    testing::Test::Check
              (pTVar2,iVar4 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x52d,"\"\" == err");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildWithLogTest, RebuildAfterFailure) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch-fail-tick2\n"
"  command = touch-fail-tick2\n"
"build out1: touch-fail-tick2 in\n"));

  string err;

  fs_.Create("in", "");

  // Run once successfully to get out1 in the log
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  EXPECT_EQ(1u, command_runner_.commands_ran_.size());

  command_runner_.commands_ran_.clear();
  state_.Reset();
  builder_.Cleanup();
  builder_.plan_.Reset();

  fs_.Tick();
  fs_.Create("in", "");

  // Run again with a failure that updates the output file timestamp
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("subcommand failed", err);
  EXPECT_EQ(1u, command_runner_.commands_ran_.size());

  command_runner_.commands_ran_.clear();
  state_.Reset();
  builder_.Cleanup();
  builder_.plan_.Reset();

  fs_.Tick();

  // Run again, should rerun even though the output file is up to date on disk
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_FALSE(builder_.AlreadyUpToDate());
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("", err);
}